

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O2

CBString * __thiscall
TreeModel::data(CBString *__return_storage_ptr__,TreeModel *this,UModelIndex *index,int role)

{
  bool bVar1;
  
  bVar1 = UModelIndex::isValid(index);
  if ((bVar1) && ((role & 0xfffffeffU) == 0)) {
    if (role == 0) {
      TreeItem::data(__return_storage_ptr__,(TreeItem *)index->i,index->c);
    }
    else {
      Bstrlib::CBString::CBString(__return_storage_ptr__,&((TreeItem *)index->i)->itemInfo);
    }
  }
  else {
    Bstrlib::CBString::CBString(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

UString TreeModel::data(const UModelIndex &index, int role) const
{
    if (!index.isValid())
        return UString();
    
    if (role != 0 && role != 0x0100)
        return UString();
    
    TreeItem *item = static_cast<TreeItem*>(index.internalPointer());
    
    if (role == 0)
        return item->data(index.column());
    else
        return item->info();
}